

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringReader.cpp
# Opt level: O3

string * __thiscall
StringReader::getLineFromIndex_abi_cxx11_
          (string *__return_storage_ptr__,StringReader *this,size_t start)

{
  char cVar1;
  ulong uVar2;
  
  uVar2 = (this->file)._M_string_length;
  if (start < uVar2) {
    do {
      cVar1 = (this->file)._M_dataplus._M_p[start];
      if ((cVar1 == '\n') || (cVar1 == '\r')) break;
      start = start + 1;
    } while (uVar2 != start);
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->file);
  return __return_storage_ptr__;
}

Assistant:

const std::string StringReader::getLineFromIndex(std::size_t start) const {
  std::size_t end = start;
  while (end < this->file.length() && !isNewLine(this->file.at(end))) {
    end++;
  }
  return this->file.substr(start, end - start);
}